

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O3

bool __thiscall FDiskFile::Open(FDiskFile *this,bool quiet)

{
  undefined8 *puVar1;
  DWORD *pDVar2;
  FileReader *pFVar3;
  FUncompressedLump *pFVar4;
  int iVar5;
  char *pcVar6;
  DiskEntry *__s;
  ulong *puVar7;
  size_t sVar8;
  uint uVar9;
  long lVar10;
  uint choicea;
  uint uVar11;
  uint uVar13;
  int iVar14;
  undefined7 in_register_00000031;
  uint *puVar15;
  DiskEntry *pDVar16;
  DWORD i;
  ulong uVar17;
  bool bVar18;
  byte bVar19;
  DiskEntryList entries;
  DWORD result;
  TArray<(anonymous_namespace)::DiskEntry,_(anonymous_namespace)::DiskEntry> local_98;
  undefined4 local_7c;
  uint local_78 [16];
  uint local_38;
  uint local_34;
  ulong uVar12;
  
  bVar19 = 0;
  pFVar3 = (this->super_FUncompressedFile).super_FResourceFile.Reader;
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar3,0,0);
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar3,local_78,4);
  local_98.Array = (DiskEntry *)0x0;
  local_98.Most = 0;
  local_98.Count = 0;
  if (local_78[0] == 0) {
    (this->super_FUncompressedFile).super_FResourceFile.NumLumps = 0;
  }
  else {
    local_7c = (undefined4)CONCAT71(in_register_00000031,quiet);
    uVar13 = local_78[0] >> 0x18 | (local_78[0] & 0xff0000) >> 8 | (local_78[0] & 0xff00) << 8 |
             local_78[0] << 0x18;
    iVar14 = uVar13 + (uVar13 == 0);
    __s = (DiskEntry *)0x0;
    uVar17 = 0;
    do {
      pFVar3 = (this->super_FUncompressedFile).super_FResourceFile.Reader;
      (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar3,local_78,0x48);
      local_38 = (local_38 >> 0x18 | (local_38 & 0xff0000) >> 8 | (local_38 & 0xff00) << 8 |
                 local_38 << 0x18) + uVar13 * 0x48 + 8;
      local_34 = local_34 >> 0x18 | (local_34 & 0xff0000) >> 8 | (local_34 & 0xff00) << 8 |
                 local_34 << 0x18;
      pcVar6 = strrchr((char *)local_78,0x2e);
      uVar12 = uVar17;
      if ((pcVar6 != (char *)0x0) && (iVar5 = strcasecmp(pcVar6,".wad"), iVar5 == 0)) {
        uVar11 = (int)uVar17 + 1;
        uVar12 = (ulong)uVar11;
        if (local_98.Most < uVar11) {
          uVar9 = (local_98.Most >> 1) + local_98.Most;
          if (local_98.Most < 0x10) {
            uVar9 = 0x10;
          }
          if (uVar9 < uVar11) {
            uVar9 = uVar11;
          }
          local_98.Most = uVar9;
          __s = (DiskEntry *)
                M_Realloc_Dbg(__s,(ulong)uVar9 * 0x48,
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./tarray.h"
                              ,0x1ad);
        }
        puVar15 = local_78;
        pDVar16 = __s + uVar17;
        for (lVar10 = 0x12; lVar10 != 0; lVar10 = lVar10 + -1) {
          *(uint *)pDVar16->name = *puVar15;
          puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
          pDVar16 = (DiskEntry *)((long)pDVar16 + (ulong)bVar19 * -8 + 4);
        }
        local_98.Count = uVar11;
      }
      iVar14 = iVar14 + -1;
      uVar17 = uVar12;
    } while (iVar14 != 0);
    (this->super_FUncompressedFile).super_FResourceFile.NumLumps = (DWORD)uVar12;
    bVar18 = (DWORD)uVar12 != 0;
    local_98.Array = __s;
    if (bVar18) {
      puVar7 = (ulong *)operator_new__(uVar12 * 0x50 + 8);
      *puVar7 = uVar12;
      lVar10 = 0;
      do {
        *(undefined8 *)((long)puVar7 + lVar10 + 0x18) = 0x8a502c;
        FString::NullString.RefCount = FString::NullString.RefCount + 1;
        *(undefined2 *)((long)puVar7 + lVar10 + 0x30) = 0;
        *(undefined1 *)((long)puVar7 + lVar10 + 0x20) = 0;
        puVar1 = (undefined8 *)((long)puVar7 + lVar10 + 0x38);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)puVar7 + lVar10 + 0x44);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined ***)((long)puVar7 + lVar10 + 8) = &PTR__FResourceLump_0088bf20;
        lVar10 = lVar10 + 0x50;
      } while (uVar12 * 0x50 != lVar10);
      (this->super_FUncompressedFile).Lumps = (FUncompressedLump *)(puVar7 + 1);
      lVar10 = 0x4c;
      uVar17 = 0;
      do {
        pFVar4 = (this->super_FUncompressedFile).Lumps;
        sVar8 = strlen(__s->name);
        pcVar6 = (char *)operator_new__(sVar8 + 1);
        strcpy(pcVar6,__s->name);
        pDVar2 = (DWORD *)((long)&(pFVar4->super_FResourceLump)._vptr_FResourceLump + lVar10);
        *(FDiskFile **)(pDVar2 + -5) = this;
        *pDVar2 = __s->offset;
        pDVar2[-0x11] = __s->size;
        *(undefined1 *)(pDVar2 + -9) = 4;
        FString::operator=((FString *)(pDVar2 + -0xf),pcVar6);
        uVar17 = uVar17 + 1;
        lVar10 = lVar10 + 0x50;
        __s = __s + 1;
      } while (uVar17 < (this->super_FUncompressedFile).super_FResourceFile.NumLumps);
      if ((char)local_7c == '\0') {
        Printf(", %d lumps\n");
      }
      goto LAB_00632f26;
    }
  }
  bVar18 = false;
LAB_00632f26:
  TArray<(anonymous_namespace)::DiskEntry,_(anonymous_namespace)::DiskEntry>::~TArray(&local_98);
  return bVar18;
}

Assistant:

bool FDiskFile::Open(bool quiet)
{
	const DWORD entryCount = GetEntryCount(Reader);
	const DWORD dataOffest = GetDataOffset(entryCount);

	DiskEntryList entries;

	for (DWORD i = 0; i < entryCount; ++i)
	{
		DiskEntry entry;
		Reader->Read(&entry, sizeof entry);

		entry.offset = BigLong(entry.offset) + dataOffest;
		entry.size   = BigLong(entry.size);

		const char* const extension = strrchr(entry.name, '.');

		if (NULL != extension && 0 == stricmp(extension, ".wad"))
		{
			entries.Push(entry);
		}
	}

	NumLumps = entries.Size();

	if (0 == NumLumps)
	{
		return false;
	}

	Lumps = new FUncompressedLump[NumLumps];

	for (DWORD i = 0; i < NumLumps; ++i)
	{
		FUncompressedLump& lump = Lumps[i];
		const DiskEntry& entry = entries[i];

		char* const lumpName = new char[strlen(entry.name) + 1];
		strcpy(lumpName, entry.name);

		lump.Owner     = this;
		lump.Position  = entry.offset;
		lump.LumpSize  = entry.size;
		lump.Flags     = LUMPF_EMBEDDED;
		lump.FullName  = lumpName;
	}

	if (!quiet)
	{
		Printf(", %d lumps\n", NumLumps);
	}

	return true;
}